

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O0

void duckdb::BinaryExecutor::
     ExecuteConstant<duckdb::string_t,_duckdb::string_t,_bool,_duckdb::BinarySingleArgumentOperatorWrapper,_duckdb::GreaterThan,_bool>
               (Vector *left,Vector *right,Vector *result,bool fun)

{
  string_t right_00;
  string_t left_00;
  bool bVar1;
  bool bVar2;
  string_t *psVar3;
  string_t *idx;
  bool *pbVar4;
  byte in_CL;
  Vector *in_RDX;
  Vector *in_RSI;
  bool *result_data;
  string_t *rdata;
  string_t *ldata;
  undefined8 uVar5;
  char *pcVar6;
  undefined8 uVar7;
  char *pcVar8;
  undefined8 in_stack_ffffffffffffffc8;
  Vector *in_stack_ffffffffffffffd0;
  
  bVar1 = (bool)(in_CL & 1);
  Vector::SetVectorType
            (in_stack_ffffffffffffffd0,(VectorType)((ulong)in_stack_ffffffffffffffc8 >> 0x38));
  psVar3 = ConstantVector::GetData<duckdb::string_t>((Vector *)0x2d24054);
  idx = ConstantVector::GetData<duckdb::string_t>((Vector *)0x2d24063);
  pbVar4 = ConstantVector::GetData<bool>((Vector *)0x2d24072);
  bVar2 = ConstantVector::IsNull((Vector *)0x2d24081);
  if ((!bVar2) && (bVar2 = ConstantVector::IsNull((Vector *)0x2d2408f), !bVar2)) {
    uVar7 = *(undefined8 *)&psVar3->value;
    pcVar8 = (psVar3->value).pointer.ptr;
    uVar5 = *(undefined8 *)&idx->value;
    pcVar6 = (idx->value).pointer.ptr;
    ConstantVector::Validity(in_RDX);
    left_00.value.pointer.ptr = pcVar8;
    left_00.value._0_8_ = uVar7;
    right_00.value.pointer.ptr = pcVar6;
    right_00.value._0_8_ = uVar5;
    bVar1 = BinarySingleArgumentOperatorWrapper::
            Operation<bool,_duckdb::GreaterThan,_duckdb::string_t,_duckdb::string_t,_bool>
                      (bVar1,left_00,right_00,(ValidityMask *)0x0,(idx_t)idx);
    *pbVar4 = bVar1;
    return;
  }
  ConstantVector::SetNull(in_RSI,SUB81((ulong)in_RDX >> 0x38,0));
  return;
}

Assistant:

static void ExecuteConstant(Vector &left, Vector &right, Vector &result, FUNC fun) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);

		auto ldata = ConstantVector::GetData<LEFT_TYPE>(left);
		auto rdata = ConstantVector::GetData<RIGHT_TYPE>(right);
		auto result_data = ConstantVector::GetData<RESULT_TYPE>(result);

		if (ConstantVector::IsNull(left) || ConstantVector::IsNull(right)) {
			ConstantVector::SetNull(result, true);
			return;
		}
		*result_data = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
		    fun, *ldata, *rdata, ConstantVector::Validity(result), 0);
	}